

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

int js_shr_slow(JSContext *ctx,JSValue *sp)

{
  JSValue *pJVar1;
  int *piVar2;
  JSValue val;
  JSValue v;
  int iVar3;
  undefined8 in_RAX;
  double dVar4;
  int64_t iVar5;
  JSRefCountHeader *p;
  uint32_t v2;
  uint32_t v1;
  undefined8 local_28;
  
  pJVar1 = sp + -1;
  piVar2 = (int *)(pJVar1->u).ptr;
  iVar5 = sp[-1].tag;
  v = *pJVar1;
  val = *pJVar1;
  local_28 = in_RAX;
  iVar3 = JS_ToInt32Free(ctx,(int32_t *)((long)&local_28 + 4),sp[-2]);
  if (iVar3 == 0) {
    iVar3 = JS_ToInt32Free(ctx,(int32_t *)&local_28,val);
    if (iVar3 == 0) {
      local_28._4_4_ = local_28._4_4_ >> ((byte)local_28 & 0x1f);
      dVar4 = (double)local_28._4_4_;
      if (-1 < (int)local_28._4_4_) {
        dVar4 = (double)(ulong)local_28._4_4_;
      }
      iVar5 = 7;
      if (-1 < (int)local_28._4_4_) {
        iVar5 = 0;
      }
      sp[-2].u.float64 = dVar4;
      sp[-2].tag = iVar5;
      return 0;
    }
  }
  else if ((0xfffffff4 < (uint)iVar5) && (iVar3 = *piVar2, *piVar2 = iVar3 + -1, iVar3 < 2)) {
    __JS_FreeValueRT(ctx->rt,v);
  }
  sp[-2].u.int32 = 0;
  sp[-2].tag = 3;
  sp[-1].u.int32 = 0;
  sp[-1].tag = 3;
  return -1;
}

Assistant:

static no_inline int js_shr_slow(JSContext *ctx, JSValue *sp)
{
    JSValue op1, op2;
    uint32_t v1, v2, r;

    op1 = sp[-2];
    op2 = sp[-1];
    if (unlikely(JS_ToUint32Free(ctx, &v1, op1))) {
        JS_FreeValue(ctx, op2);
        goto exception;
    }
    if (unlikely(JS_ToUint32Free(ctx, &v2, op2)))
        goto exception;
    r = v1 >> (v2 & 0x1f);
    sp[-2] = JS_NewUint32(ctx, r);
    return 0;
 exception:
    sp[-2] = JS_UNDEFINED;
    sp[-1] = JS_UNDEFINED;
    return -1;
}